

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingCompressionState<unsigned_char,_true,_signed_char>::FlushAndCreateSegmentIfFull
          (BitpackingCompressionState<unsigned_char,_true,_signed_char> *this,
          idx_t required_data_bytes,idx_t required_meta_bytes)

{
  idx_t iVar1;
  __int_type _Var2;
  bool bVar3;
  pointer pCVar4;
  
  bVar3 = CanStore(this,required_data_bytes,required_meta_bytes);
  if (bVar3) {
    return;
  }
  pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  iVar1 = (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).start;
  pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  _Var2 = (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  FlushSegment(this);
  CreateEmptySegment(this,_Var2 + iVar1);
  return;
}

Assistant:

void FlushAndCreateSegmentIfFull(idx_t required_data_bytes, idx_t required_meta_bytes) {
		if (!CanStore(required_data_bytes, required_meta_bytes)) {
			idx_t row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
		}
	}